

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O0

void socketpair_pinger_new(int vectored_writes)

{
  int iVar1;
  uv_handle_type uVar2;
  uv_loop_t *puVar3;
  uv_tcp_t *tcp;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  void *eval_b_6;
  void *eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  uv_tcp_t *ponger;
  uv_os_sock_t fds [2];
  pinger_t *pinger;
  int vectored_writes_local;
  
  fds = (uv_os_sock_t  [2])malloc(0x168);
  if (fds == (uv_os_sock_t  [2])0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x136,"pinger","!=","NULL",0,"!=",0);
    abort();
  }
  *(int *)fds = vectored_writes;
  *(int *)((long)fds + 8) = 0;
  *(int *)((long)fds + 4) = 0;
  *(char **)((long)fds + 0x160) = PONG;
  uv_default_loop();
  iVar1 = uv_socketpair(1,0,(uv_os_sock_t *)&ponger,0x40,0x40);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x13e,"uv_socketpair(SOCK_STREAM, 0, fds, UV_NONBLOCK_PIPE, UV_NONBLOCK_PIPE)","==","0"
            ,(long)iVar1,"==",0);
    abort();
  }
  uVar2 = uv_guess_handle((uv_os_fd_t)ponger);
  if ((ulong)uVar2 != 7) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x141,"uv_guess_handle((uv_os_fd_t) fds[0])","==","UV_NAMED_PIPE",(ulong)uVar2,"==",7);
    abort();
  }
  uVar2 = uv_guess_handle(ponger._4_4_);
  if ((ulong)uVar2 != 7) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x142,"uv_guess_handle((uv_os_fd_t) fds[1])","==","UV_NAMED_PIPE",(ulong)uVar2,"==",7);
    abort();
  }
  puVar3 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar3,(uv_tcp_t *)((long)fds + 0x10));
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x145,"uv_tcp_init(uv_default_loop(), &pinger->stream.tcp)","==","0",(long)iVar1,"==",0
           );
    abort();
  }
  *(uv_os_sock_t (*) [2])((long)fds + 0x10) = fds;
  iVar1 = uv_tcp_open((uv_tcp_t *)((long)fds + 0x10),ponger._4_4_);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x147,"uv_tcp_open(&pinger->stream.tcp, fds[1])","==","0",(long)iVar1,"==",0);
    abort();
  }
  tcp = (uv_tcp_t *)malloc(0xd8);
  if (tcp == (uv_tcp_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x14a,"ponger","!=","NULL",0,"!=",0);
    abort();
  }
  tcp->data = (void *)0x0;
  puVar3 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar3,tcp);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x14c,"uv_tcp_init(uv_default_loop(), ponger)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_tcp_open(tcp,(uv_os_fd_t)ponger);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x14d,"uv_tcp_open(ponger, fds[0])","==","0",(long)iVar1,"==",0);
    abort();
  }
  pinger_write_ping((pinger_t *)fds);
  iVar1 = uv_read_start((uv_stream_t *)((long)fds + 0x10),alloc_cb,pinger_read_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x153,"uv_read_start((uv_stream_t*) &pinger->stream.tcp, alloc_cb, pinger_read_cb)",
            "==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_read_start((uv_stream_t *)tcp,alloc_cb,ponger_read_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x156,"uv_read_start((uv_stream_t*) ponger, alloc_cb, ponger_read_cb)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  return;
}

Assistant:

static void socketpair_pinger_new(int vectored_writes) {
  pinger_t* pinger;
  uv_os_sock_t fds[2];
  uv_tcp_t* ponger;

  pinger = malloc(sizeof(*pinger));
  ASSERT_NOT_NULL(pinger);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;
  pinger->pong = PONG;

  /* Try to make a socketpair and do NUM_PINGS ping-pongs. */
  (void)uv_default_loop(); /* ensure WSAStartup has been performed */
  ASSERT_OK(uv_socketpair(SOCK_STREAM, 0, fds, UV_NONBLOCK_PIPE, UV_NONBLOCK_PIPE));
#ifndef _WIN32
  /* On Windows, this is actually a UV_TCP, but libuv doesn't detect that. */
  ASSERT_EQ(uv_guess_handle((uv_os_fd_t) fds[0]), UV_NAMED_PIPE);
  ASSERT_EQ(uv_guess_handle((uv_os_fd_t) fds[1]), UV_NAMED_PIPE);
#endif

  ASSERT_OK(uv_tcp_init(uv_default_loop(), &pinger->stream.tcp));
  pinger->stream.pipe.data = pinger;
  ASSERT_OK(uv_tcp_open(&pinger->stream.tcp, fds[1]));

  ponger = malloc(sizeof(*ponger));
  ASSERT_NOT_NULL(ponger);
  ponger->data = NULL;
  ASSERT_OK(uv_tcp_init(uv_default_loop(), ponger));
  ASSERT_OK(uv_tcp_open(ponger, fds[0]));

  pinger_write_ping(pinger);

  ASSERT_OK(uv_read_start((uv_stream_t*) &pinger->stream.tcp,
                          alloc_cb,
                          pinger_read_cb));
  ASSERT_OK(uv_read_start((uv_stream_t*) ponger,
                          alloc_cb,
                          ponger_read_cb));
}